

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

void Aig_ManTransferRepr(Aig_Man_t *pNew,Aig_Man_t *pOld)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **local_40;
  int local_2c;
  int nReprsAllocNew;
  int k;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *pOld_local;
  Aig_Man_t *pNew_local;
  
  if (pNew->pReprs != (Aig_Obj_t **)0x0) {
    iVar2 = pNew->nReprsAlloc;
    iVar1 = Aig_ManObjNumMax(pNew);
    if (iVar2 < iVar1) {
      iVar2 = Aig_ManObjNumMax(pNew);
      iVar2 = iVar2 * 2;
      if (pNew->pReprs == (Aig_Obj_t **)0x0) {
        local_40 = (Aig_Obj_t **)malloc((long)iVar2 << 3);
      }
      else {
        local_40 = (Aig_Obj_t **)realloc(pNew->pReprs,(long)iVar2 << 3);
      }
      pNew->pReprs = local_40;
      memset(pNew->pReprs + pNew->nReprsAlloc,0,(long)(iVar2 - pNew->nReprsAlloc) << 3);
      pNew->nReprsAlloc = iVar2;
    }
    for (local_2c = 0; iVar2 = Vec_PtrSize(pOld->vObjs), local_2c < iVar2; local_2c = local_2c + 1)
    {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pOld->vObjs,local_2c);
      if ((pAVar3 != (Aig_Obj_t *)0x0) &&
         (pAVar4 = Aig_ObjFindRepr(pOld,pAVar3), pAVar4 != (Aig_Obj_t *)0x0)) {
        pAVar4 = Aig_Regular((Aig_Obj_t *)(pAVar4->field_5).pData);
        pAVar3 = Aig_Regular((Aig_Obj_t *)(pAVar3->field_5).pData);
        Aig_ObjSetRepr_(pNew,pAVar4,pAVar3);
      }
    }
    return;
  }
  __assert_fail("pNew->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                ,0xd7,"void Aig_ManTransferRepr(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

void Aig_ManTransferRepr( Aig_Man_t * pNew, Aig_Man_t * pOld )
{
    Aig_Obj_t * pObj, * pRepr;
    int k;
    assert( pNew->pReprs != NULL );
    // extend storage to fix pNew
    if ( pNew->nReprsAlloc < Aig_ManObjNumMax(pNew) )
    {
        int nReprsAllocNew = 2 * Aig_ManObjNumMax(pNew);
        pNew->pReprs = ABC_REALLOC( Aig_Obj_t *, pNew->pReprs, nReprsAllocNew );
        memset( pNew->pReprs + pNew->nReprsAlloc, 0, sizeof(Aig_Obj_t *) * (nReprsAllocNew-pNew->nReprsAlloc) );
        pNew->nReprsAlloc = nReprsAllocNew;
    }
    // go through the nodes which have representatives
    Aig_ManForEachObj( pOld, pObj, k )
        if ( (pRepr = Aig_ObjFindRepr(pOld, pObj)) )
            Aig_ObjSetRepr_( pNew, Aig_Regular((Aig_Obj_t *)pRepr->pData), Aig_Regular((Aig_Obj_t *)pObj->pData) ); 
}